

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O1

int Cudd_EqualSupNorm(DdManager *dd,DdNode *f,DdNode *g,double tolerance,int pr)

{
  uint uVar1;
  int iVar2;
  DdNode *pDVar3;
  uint uVar4;
  DdNode *f_00;
  DdNode *g_00;
  int iVar5;
  DdNode *g_01;
  double dVar6;
  double dVar7;
  
  iVar5 = 1;
  if (f != g) {
    if ((*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) &&
       (*(int *)((ulong)g & 0xfffffffffffffffe) == 0x7fffffff)) {
      dVar7 = (f->type).value - (g->type).value;
      dVar6 = -dVar7;
      if (-dVar7 <= dVar7) {
        dVar6 = dVar7;
      }
      if (tolerance <= dVar6) {
        iVar5 = 0;
        if (0 < pr) {
          fwrite("Offending nodes:\n",0x11,1,(FILE *)dd->out);
          fprintf((FILE *)dd->out,"f: address = %p\t value = %40.30f\n",(f->type).value,f);
          fprintf((FILE *)dd->out,"g: address = %p\t value = %40.30f\n",(g->type).value,g);
          iVar5 = 0;
        }
      }
    }
    else {
      pDVar3 = cuddCacheLookup2(dd,Cudd_EqualSupNorm,f,g);
      if (pDVar3 == (DdNode *)0x0) {
        uVar1 = 0x7fffffff;
        uVar4 = 0x7fffffff;
        if ((ulong)f->index != 0x7fffffff) {
          uVar4 = dd->perm[f->index];
        }
        if ((ulong)g->index != 0x7fffffff) {
          uVar1 = dd->perm[g->index];
        }
        f_00 = f;
        pDVar3 = f;
        if (uVar4 <= uVar1) {
          pDVar3 = (f->type).kids.T;
          f_00 = (f->type).kids.E;
        }
        g_00 = g;
        g_01 = g;
        if (uVar1 <= uVar4) {
          g_00 = (g->type).kids.T;
          g_01 = (g->type).kids.E;
        }
        iVar2 = Cudd_EqualSupNorm(dd,pDVar3,g_00,tolerance,pr);
        iVar5 = 0;
        if (iVar2 != 0) {
          iVar2 = Cudd_EqualSupNorm(dd,f_00,g_01,tolerance,pr);
          if (iVar2 != 0) {
            cuddCacheInsert2(dd,Cudd_EqualSupNorm,f,g,dd->one);
            iVar5 = 1;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
Cudd_EqualSupNorm(
  DdManager * dd /* manager */,
  DdNode * f /* first ADD */,
  DdNode * g /* second ADD */,
  CUDD_VALUE_TYPE  tolerance /* maximum allowed difference */,
  int  pr /* verbosity level */)
{
    DdNode *fv, *fvn, *gv, *gvn, *r;
    unsigned int topf, topg;

    statLine(dd);
    /* Check terminal cases. */
    if (f == g) return(1);
    if (Cudd_IsConstant(f) && Cudd_IsConstant(g)) {
        if (ddEqualVal(cuddV(f),cuddV(g),tolerance)) {
            return(1);
        } else {
            if (pr>0) {
                (void) fprintf(dd->out,"Offending nodes:\n");
                (void) fprintf(dd->out,
                               "f: address = %p\t value = %40.30f\n",
                               (void *) f, cuddV(f));
                (void) fprintf(dd->out,
                               "g: address = %p\t value = %40.30f\n",
                               (void *) g, cuddV(g));
            }
            return(0);
        }
    }

    /* We only insert the result in the cache if the comparison is
    ** successful. Therefore, if we hit we return 1. */
    r = cuddCacheLookup2(dd,(DD_CTFP)Cudd_EqualSupNorm,f,g);
    if (r != NULL) {
        return(1);
    }

    /* Compute the cofactors and solve the recursive subproblems. */
    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);

    if (topf <= topg) {fv = cuddT(f); fvn = cuddE(f);} else {fv = fvn = f;}
    if (topg <= topf) {gv = cuddT(g); gvn = cuddE(g);} else {gv = gvn = g;}

    if (!Cudd_EqualSupNorm(dd,fv,gv,tolerance,pr)) return(0);
    if (!Cudd_EqualSupNorm(dd,fvn,gvn,tolerance,pr)) return(0);

    cuddCacheInsert2(dd,(DD_CTFP)Cudd_EqualSupNorm,f,g,DD_ONE(dd));

    return(1);

}